

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O0

DdNode * Cudd_addXeqy(DdManager *dd,int N,DdNode **x,DdNode **y)

{
  DdNode *h;
  DdNode *pDVar1;
  DdNode *pDVar2;
  int local_5c;
  int i;
  DdNode *w;
  DdNode *v;
  DdNode *u;
  DdNode *zero;
  DdNode *one;
  DdNode **y_local;
  DdNode **x_local;
  int N_local;
  DdManager *dd_local;
  
  pDVar2 = dd->one;
  h = dd->zero;
  pDVar1 = Cudd_addIte(dd,y[N + -1],pDVar2,h);
  if (pDVar1 == (DdNode *)0x0) {
    dd_local = (DdManager *)0x0;
  }
  else {
    *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
    pDVar2 = Cudd_addIte(dd,y[N + -1],h,pDVar2);
    if (pDVar2 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,pDVar1);
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
      v = Cudd_addIte(dd,x[N + -1],pDVar1,pDVar2);
      if (v == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar1);
        Cudd_RecursiveDeref(dd,pDVar2);
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) + 1;
        Cudd_RecursiveDeref(dd,pDVar1);
        Cudd_RecursiveDeref(dd,pDVar2);
        for (local_5c = N + -2; -1 < local_5c; local_5c = local_5c + -1) {
          pDVar2 = Cudd_addIte(dd,y[local_5c],v,h);
          if (pDVar2 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,v);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
          pDVar1 = Cudd_addIte(dd,y[local_5c],h,v);
          if (pDVar1 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,v);
            Cudd_RecursiveDeref(dd,pDVar2);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref(dd,v);
          v = Cudd_addIte(dd,x[local_5c],pDVar2,pDVar1);
          if (pDVar1 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar2);
            Cudd_RecursiveDeref(dd,(DdNode *)0x0);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref(dd,pDVar2);
          Cudd_RecursiveDeref(dd,pDVar1);
        }
        *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) + -1;
        dd_local = (DdManager *)v;
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addXeqy(
  DdManager * dd /* DD manager */,
  int  N /* number of x and y variables */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */)
{
    DdNode *one, *zero;
    DdNode *u, *v, *w;
    int     i;

    one = DD_ONE(dd);
    zero = DD_ZERO(dd);

    /* Build bottom part of ADD outside loop. */
    v = Cudd_addIte(dd, y[N-1], one, zero);
    if (v == NULL) return(NULL);
    cuddRef(v);
    w = Cudd_addIte(dd, y[N-1], zero, one);
    if (w == NULL) {
        Cudd_RecursiveDeref(dd, v);
        return(NULL);
    }
    cuddRef(w);
    u = Cudd_addIte(dd, x[N-1], v, w);
    if (u == NULL) {
        Cudd_RecursiveDeref(dd, v);
        Cudd_RecursiveDeref(dd, w);
        return(NULL);
    }
    cuddRef(u);
    Cudd_RecursiveDeref(dd, v);
    Cudd_RecursiveDeref(dd, w);

    /* Loop to build the rest of the ADD. */
    for (i = N-2; i >= 0; i--) {
        v = Cudd_addIte(dd, y[i], u, zero);
        if (v == NULL) {
            Cudd_RecursiveDeref(dd, u);
            return(NULL);
        }
        cuddRef(v);
        w = Cudd_addIte(dd, y[i], zero, u);
        if (w == NULL) {
            Cudd_RecursiveDeref(dd, u);
            Cudd_RecursiveDeref(dd, v);
            return(NULL);
        }
        cuddRef(w);
        Cudd_RecursiveDeref(dd, u);
        u = Cudd_addIte(dd, x[i], v, w);
        if (w == NULL) {
            Cudd_RecursiveDeref(dd, v);
            Cudd_RecursiveDeref(dd, w);
            return(NULL);
        }
        cuddRef(u);
        Cudd_RecursiveDeref(dd, v);
        Cudd_RecursiveDeref(dd, w);
    }
    cuddDeref(u);
    return(u);

}